

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_sign.c
# Opt level: O2

int SM2_sign_ex(uint8_t *sig,int *siglen,uint8_t *msg,int msglen,uint8_t *id,int idlen,uint8_t *rand
               ,uint8_t *pubkey_x,uint8_t *pubkey_y,uint8_t *privkey,SM2_SIG_MODE mode,
               SM2_CTX *sm2_ctx)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint8_t entl_str [2];
  uint8_t e [32];
  uint8_t ZA [32];
  SM3_CTX sm3_ctx;
  
  auVar9._0_4_ = -(uint)((int)pubkey_x == 0);
  auVar9._4_4_ = -(uint)(pubkey_x._4_4_ == 0);
  auVar9._8_4_ = -(uint)((int)pubkey_y == 0);
  auVar9._12_4_ = -(uint)(pubkey_y._4_4_ == 0);
  auVar8._4_4_ = auVar9._0_4_;
  auVar8._0_4_ = auVar9._4_4_;
  auVar8._8_4_ = auVar9._12_4_;
  auVar8._12_4_ = auVar9._8_4_;
  auVar7._0_4_ = -(uint)((int)privkey == 0);
  auVar7._4_4_ = -(uint)((int)((ulong)privkey >> 0x20) == 0);
  auVar7._8_4_ = -(uint)((int)sm2_ctx == 0);
  auVar7._12_4_ = -(uint)((int)((ulong)sm2_ctx >> 0x20) == 0);
  auVar2._4_4_ = auVar7._0_4_;
  auVar2._0_4_ = auVar7._4_4_;
  auVar2._8_4_ = auVar7._12_4_;
  auVar2._12_4_ = auVar7._8_4_;
  auVar9 = packssdw(auVar8 & auVar9,auVar2 & auVar7);
  auVar4._0_4_ = -(uint)((int)sig == 0);
  auVar4._4_4_ = -(uint)((int)((ulong)sig >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)siglen == 0);
  auVar4._12_4_ = -(uint)((int)((ulong)siglen >> 0x20) == 0);
  auVar3._4_4_ = auVar4._0_4_;
  auVar3._0_4_ = auVar4._4_4_;
  auVar3._8_4_ = auVar4._12_4_;
  auVar3._12_4_ = auVar4._8_4_;
  auVar6._0_4_ = -(uint)((int)msg == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)msg >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)id == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)id >> 0x20) == 0);
  auVar5._4_4_ = auVar6._0_4_;
  auVar5._0_4_ = auVar6._4_4_;
  auVar5._8_4_ = auVar6._12_4_;
  auVar5._12_4_ = auVar6._8_4_;
  auVar6 = packssdw(auVar5 & auVar6,auVar3 & auVar4);
  auVar6 = packssdw(auVar6,auVar9);
  iVar1 = 0;
  if (((uint)idlen < 0x10000 && -1 < msglen) &&
      ((((((((auVar6 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar6 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar6 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar6 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf])) {
    entl_str[0] = (uint8_t)((uint)idlen >> 5);
    entl_str[1] = (char)idlen * '\b';
    SM3_init(&sm3_ctx);
    SM3_update(&sm3_ctx,entl_str,2);
    SM3_update(&sm3_ctx,id,idlen);
    SM3_update(&sm3_ctx,a_b_gx_gy,0x80);
    SM3_update(&sm3_ctx,pubkey_x,0x20);
    SM3_update(&sm3_ctx,pubkey_y,0x20);
    SM3_final(&sm3_ctx,ZA);
    SM3_init(&sm3_ctx);
    SM3_update(&sm3_ctx,ZA,0x20);
    SM3_update(&sm3_ctx,msg,msglen);
    SM3_final(&sm3_ctx,e);
    iVar1 = SM2_sign(sig,siglen,e,rand,privkey,mode,sm2_ctx);
  }
  return iVar1;
}

Assistant:

int SM2_sign_ex(uint8_t *sig, int *siglen,  
                const uint8_t *msg, int msglen, 
                const uint8_t *id, int idlen,
                const uint8_t rand[32], 
                const uint8_t pubkey_x[32], const uint8_t pubkey_y[32], const uint8_t privkey[32],
                SM2_SIG_MODE mode, SM2_CTX *sm2_ctx)
{
    int ret = GML_ERROR;
    uint8_t ZA[32];
    uint8_t e[32];
    uint8_t entl_str[2];
    SM3_CTX sm3_ctx;

    if (msg == NULL || msglen < 0 || id == NULL || idlen < 0 || idlen >= 65536 || sig == NULL || siglen == NULL || 
        pubkey_x == NULL || pubkey_y == NULL || privkey == NULL || sm2_ctx == NULL)
        goto end;

    entl_str[0] = (uint8_t)((idlen << 3) >> 8);
    entl_str[1] = (uint8_t)((idlen << 3) & 0xff);
    /* ZA = SM3 (ENTLA || IDA || a || b || Gx || Gy || Ax || Ay) */
    SM3_init(&sm3_ctx);
    SM3_update(&sm3_ctx, entl_str, 2);
    SM3_update(&sm3_ctx, id, idlen);
    SM3_update(&sm3_ctx, a_b_gx_gy, 128);
    SM3_update(&sm3_ctx, pubkey_x, 32);
    SM3_update(&sm3_ctx, pubkey_y, 32);
    SM3_final(&sm3_ctx, ZA);

    /* e = SM3(ZA || m) */
    SM3_init(&sm3_ctx);
    SM3_update(&sm3_ctx, ZA, 32);
    SM3_update(&sm3_ctx, msg, msglen);
    SM3_final(&sm3_ctx, e);

    if (SM2_sign(sig, siglen, e, rand, privkey, mode, sm2_ctx) == GML_ERROR)
        goto end;

    ret = GML_OK;
end:
    return ret;
}